

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

void __thiscall
VW::config::option_group_definition::~option_group_definition(option_group_definition *this)

{
  string *in_RDI;
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  *unaff_retaddr;
  
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(unaff_retaddr);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

option_group_definition(std::string name) : m_name(name) {}